

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_a_star.cpp
# Opt level: O0

void __thiscall
IDAStarSearch::IDAStarSearch(IDAStarSearch *this,ifstream *ifs,Point *maze_entry,Point *maze_target)

{
  Point *maze_target_local;
  Point *maze_entry_local;
  ifstream *ifs_local;
  IDAStarSearch *this_local;
  
  Search::Search(&this->super_Search,ifs,maze_entry,maze_target);
  (this->super_Search)._vptr_Search = (_func_int **)&PTR_maze_search_00110d88;
  std::deque<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>::deque(&this->frontier)
  ;
  return;
}

Assistant:

IDAStarSearch::IDAStarSearch(ifstream &ifs, const Point &maze_entry, const Point &maze_target) : Search(ifs, maze_entry,
                                                                                                        maze_target) {}